

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_exp.h
# Opt level: O0

const_ret_type __thiscall
dlib::
matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::operator()(matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
             *this,long r,long c)

{
  long in_RDX;
  matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
  *in_RSI;
  matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *in_RDI;
  const_ret_type cVar1;
  
  ref(in_RDI);
  cVar1 = matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>
          ::operator()(in_RSI,in_RDX,0x2823ad);
  return cVar1;
}

Assistant:

inline const_ret_type operator() (
            long r,
            long c
        ) const 
        { 
            DLIB_ASSERT(r < nr() && c < nc() && r >= 0 && c >= 0, 
                "\tconst type matrix_exp::operator(r,c)"
                << "\n\tYou must give a valid row and column"
                << "\n\tr:    " << r 
                << "\n\tc:    " << c
                << "\n\tnr(): " << nr()
                << "\n\tnc(): " << nc() 
                << "\n\tthis: " << this
                );
            return ref()(r,c); 
        }